

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execMove3<(moira::Instr)71,(moira::Mode)2,(moira::Size)2>(Moira *this,u16 opcode)

{
  bool bVar1;
  uint in_EAX;
  u32 data;
  u32 ea;
  uint local_18;
  u32 local_14;
  
  local_18 = in_EAX;
  bVar1 = readOp<(moira::Mode)2,(moira::Size)2,0ul>(this,opcode & 7,&local_14,&local_18);
  if (bVar1) {
    (this->reg).sr.n = (bool)((byte)(local_18 >> 0xf) & 1);
    (this->reg).sr.z = (short)local_18 == 0;
    (this->reg).sr.v = false;
    (this->reg).sr.c = false;
    bVar1 = writeOp<(moira::Mode)3,(moira::Size)2,64ul>(this,opcode >> 9 & 7,local_18);
    if (bVar1) {
      prefetch<4ul>(this);
      (this->reg).sr.n = (bool)((byte)(local_18 >> 0xf) & 1);
      (this->reg).sr.z = (short)local_18 == 0;
      (this->reg).sr.v = false;
      (this->reg).sr.c = false;
    }
  }
  return;
}

Assistant:

void
Moira::execMove3(u16 opcode)
{
    u32 ea, data;

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    if (!readOp <M, S, STD_AE_FRAME> (src, ea, data)) return;

    if (S == Word || (M != MODE_DN && M != MODE_AN && M != MODE_IM)) {
        reg.sr.n = NBIT<Word>(data);
        reg.sr.z = ZERO<Word>(data);
        reg.sr.v = 0;
        reg.sr.c = 0;
    }

    if (!writeOp <MODE_PI, S, AE_INC_PC> (dst, data)) return;
    prefetch<POLLIPL>();

    reg.sr.n = NBIT<S>(data);
    reg.sr.z = ZERO<S>(data);
    reg.sr.v = 0;
    reg.sr.c = 0;
}